

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBcc<(moira::Core)0,(moira::Instr)24,(moira::Mode)12,2>(Moira *this,u16 opcode)

{
  undefined8 uStack_10;
  
  if ((this->reg).sr.v == false) {
    (this->reg).pc = (this->reg).pc + (int)(short)(this->queue).irc;
    fullPrefetch<(moira::Core)0,4ull,0>(this);
    uStack_10 = 10;
  }
  else {
    readExt<(moira::Core)0>(this);
    prefetch<(moira::Core)0,4ull>(this);
    uStack_10 = 0xc;
  }
  (*this->_vptr_Moira[2])(this,uStack_10);
  return;
}

Assistant:

void
Moira::execBcc(u16 opcode)
{
    AVAILABILITY(S == Long ? Core::C68020 : Core::C68000)

    u32 oldpc = reg.pc;

    SYNC(2);

    if (cond<I>()) {

        u32 disp = S == Byte ? (u8)opcode : queue.irc;

        if (S == Long) {

            readExt<C>();
            disp = disp << 16 | queue.irc;
        }

        u32 newpc = U32_ADD(oldpc, SEXT<S>(disp));

        // Check for address error
        if (misaligned<C>(newpc)) {
            throw AddressError(makeFrame(newpc));
        }

        // Take branch
        reg.pc = newpc;
        fullPrefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   (10, 10,  6,       10, 10,  6,        0,  0,  6)

    } else {

        // Fall through to next instruction
        if constexpr (C == Core::C68000) SYNC(2);
        if constexpr (S == Word || S == Long) readExt<C>();
        if constexpr (S == Long) readExt<C>();
        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_IP   ( 8,  6,  4,       12, 10,  6,        0,  0,  6)
    }

    FINALIZE
}